

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceAABB.cpp
# Opt level: O0

AABB * __thiscall IceMaths::AABB::Add(AABB *this,AABB *aabb)

{
  undefined8 uVar1;
  float local_24c;
  float local_248;
  float local_244;
  float local_234;
  float local_230;
  float local_22c;
  undefined1 local_214 [8];
  Point Max;
  Point Tmp;
  undefined1 local_1ec [8];
  Point Min;
  AABB *aabb_local;
  AABB *this_local;
  float local_1b4;
  float fStack_1b0;
  float *local_1a8;
  AABB *local_1a0;
  float local_194;
  float fStack_190;
  undefined1 *local_188;
  AABB *local_180;
  float *local_178;
  undefined1 *local_170;
  float local_164;
  float fStack_160;
  float *local_158;
  AABB *local_150;
  float local_144;
  float fStack_140;
  undefined1 *local_138;
  AABB *local_130;
  float *local_128;
  undefined1 *local_120;
  float *local_118;
  float *local_110;
  float *local_108;
  float *local_100;
  Point *local_c8;
  AABB *local_c0;
  float *local_b8;
  float local_ac;
  float local_a8;
  float local_a4;
  float *local_a0;
  Point *local_98;
  AABB *local_90;
  float *local_88;
  float local_7c;
  float local_78;
  float local_74;
  float *local_70;
  Point *local_68;
  AABB *local_60;
  float *local_58;
  float local_4c;
  float local_48;
  float local_44;
  float *local_40;
  Point *local_38;
  AABB *local_30;
  float *local_28;
  float local_1c;
  float local_18;
  float local_14;
  float *local_10;
  
  local_188 = local_1ec;
  local_c8 = &this->mExtents;
  local_b8 = &local_194;
  local_a4 = (this->mCenter).x - local_c8->x;
  local_a8 = (this->mCenter).y - (this->mExtents).y;
  local_ac = (this->mCenter).z - (this->mExtents).z;
  local_a0 = &local_194;
  local_194 = local_a4;
  fStack_190 = local_a8;
  local_1ec._4_4_ = (undefined4)((ulong)_local_194 >> 0x20);
  local_1ec._0_4_ = (undefined4)_local_194;
  local_108 = &local_194;
  local_1a8 = &Max.y;
  local_98 = &aabb->mExtents;
  local_88 = &local_1b4;
  local_74 = (aabb->mCenter).x - local_98->x;
  local_78 = (aabb->mCenter).y - (aabb->mExtents).y;
  local_7c = (aabb->mCenter).z - (aabb->mExtents).z;
  local_70 = &local_1b4;
  local_1b4 = local_74;
  fStack_1b0 = local_78;
  Max.y = (float)_local_1b4;
  local_100 = &local_1b4;
  local_170 = local_1ec;
  local_178 = &Max.y;
  if (Max.y <= (float)local_1ec._0_4_) {
    local_22c = Max.y;
  }
  else {
    local_22c = (float)local_1ec._0_4_;
  }
  local_1ec._0_4_ = local_22c;
  Max.z = (float)((ulong)_local_1b4 >> 0x20);
  if (Max.z <= (float)local_1ec._4_4_) {
    local_230 = Max.z;
  }
  else {
    local_230 = (float)local_1ec._4_4_;
  }
  local_1ec._4_4_ = local_230;
  local_234 = local_7c;
  if (local_ac < local_7c) {
    local_234 = local_ac;
  }
  Min.x = local_234;
  local_138 = local_214;
  local_68 = &this->mExtents;
  local_58 = &local_144;
  local_44 = (this->mCenter).x + local_68->x;
  local_48 = (this->mCenter).y + (this->mExtents).y;
  local_4c = (this->mCenter).z + (this->mExtents).z;
  local_40 = &local_144;
  local_144 = local_44;
  fStack_140 = local_48;
  local_214._4_4_ = (undefined4)((ulong)_local_144 >> 0x20);
  local_214._0_4_ = (undefined4)_local_144;
  local_118 = &local_144;
  local_158 = &Max.y;
  local_38 = &aabb->mExtents;
  local_28 = &local_164;
  local_14 = (aabb->mCenter).x + local_38->x;
  local_18 = (aabb->mCenter).y + (aabb->mExtents).y;
  local_1c = (aabb->mCenter).z + (aabb->mExtents).z;
  local_10 = &local_164;
  local_164 = local_14;
  fStack_160 = local_18;
  Max.y = local_164;
  Max.z = fStack_160;
  uVar1 = Max._4_8_;
  Max.y = (float)_local_164;
  local_110 = &local_164;
  local_120 = local_214;
  local_128 = &Max.y;
  if ((float)local_214._0_4_ <= Max.y) {
    local_244 = Max.y;
  }
  else {
    local_244 = (float)local_214._0_4_;
  }
  local_214._0_4_ = local_244;
  Max.z = SUB84(_local_164,4);
  if ((float)local_214._4_4_ <= Max.z) {
    local_248 = Max.z;
  }
  else {
    local_248 = (float)local_214._4_4_;
  }
  local_214._4_4_ = local_248;
  local_24c = local_1c;
  if (local_1c < local_4c) {
    local_24c = local_4c;
  }
  Max.x = local_24c;
  Min._4_8_ = aabb;
  local_1a0 = aabb;
  local_180 = this;
  local_150 = aabb;
  local_130 = this;
  local_c0 = this;
  local_90 = aabb;
  local_60 = this;
  local_30 = aabb;
  Max._4_8_ = uVar1;
  SetMinMax(this,(Point *)local_1ec,(Point *)local_214);
  return this;
}

Assistant:

AABB& AABB::Add(const AABB& aabb)
{
	// Compute new min & max values
	Point Min;	GetMin(Min);
	Point Tmp;	aabb.GetMin(Tmp);
	Min.Min(Tmp);

	Point Max;	GetMax(Max);
	aabb.GetMax(Tmp);
	Max.Max(Tmp);

	// Update this
	SetMinMax(Min, Max);
	return *this;
}